

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_serialize.c
# Opt level: O0

char * serialize_get(char *r,SBufExt *sbx,TValue *o)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  GCstr *pGVar4;
  TValue *pTVar5;
  void *pvVar6;
  undefined4 local_37c;
  uint32_t local_370;
  uint32_t local_36c;
  char *local_348;
  uintptr_t ud;
  TValue *cdo;
  GCcdata *cd;
  uint32_t sz;
  TValue *v_6;
  TValue k;
  TValue *oe;
  TValue *oa;
  uint64_t uStack_300;
  uint32_t idx_1;
  GCtab *dict_mt;
  GCtab *mt;
  GCtab *t;
  uint32_t local_2e0;
  uint32_t nhash;
  uint32_t narray;
  uint32_t idx;
  GCtab *dict_str;
  uint32_t len;
  uint32_t tp;
  char *w;
  TValue *o_local;
  SBufExt *sbx_local;
  char *r_local;
  uint32_t *puStack_2a0;
  uint32_t v_5;
  SBufExt *local_298;
  SBufExt *local_290;
  SBufExt *local_288;
  uint local_27c;
  uint32_t *puStack_278;
  uint32_t v_4;
  SBufExt *local_270;
  SBufExt *local_268;
  SBufExt *local_260;
  uint local_254;
  uint32_t *puStack_250;
  uint32_t v_3;
  SBufExt *local_248;
  SBufExt *local_240;
  SBufExt *local_238;
  uint local_22c;
  uint32_t *puStack_228;
  uint32_t v_2;
  SBufExt *local_220;
  SBufExt *local_218;
  SBufExt *local_210;
  uint local_204;
  uint32_t *puStack_200;
  uint32_t v_1;
  SBufExt *local_1f8;
  SBufExt *local_1f0;
  SBufExt *local_1e8;
  uint local_1dc;
  uint32_t *puStack_1d8;
  uint32_t v;
  SBufExt *local_1d0;
  SBufExt *local_1c8;
  SBufExt *local_1c0;
  GCtab *local_1b8;
  char *local_1b0;
  ulong local_1a8;
  undefined4 local_19c;
  GCtab *local_198;
  char *local_190;
  ulong local_188;
  undefined4 local_17c;
  GCtab *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  ulong local_158;
  SBufExt *local_d8;
  void *local_98;
  GCcdata *cd_1;
  lua_State *local_88;
  
  _len = (SBufExt *)sbx->w;
  puStack_1d8 = (uint32_t *)((long)&dict_str + 4);
  w = (char *)o;
  o_local = (TValue *)sbx;
  local_1d0 = _len;
  if (r < _len) {
    dict_str._4_4_ = (uint)(byte)*r;
    local_1c8 = (SBufExt *)(r + 1);
    local_1dc = dict_str._4_4_;
    if (0xdf < dict_str._4_4_) {
      sbx_local = (SBufExt *)r;
      local_1c8 = (SBufExt *)serialize_ru124_((char *)local_1c8,(char *)_len,puStack_1d8);
    }
    local_1c0 = local_1c8;
  }
  else {
    local_1c0 = (SBufExt *)0x0;
    local_1c8 = (SBufExt *)r;
  }
  pcVar2 = w;
  sbx_local = local_1c0;
  if (local_1c0 != (SBufExt *)0x0) {
    if (dict_str._4_4_ < 0x20) {
      if (dict_str._4_4_ == 6) {
        if ((SBufExt *)((long)&local_1c0->w + 4U) <= _len) {
          *(double *)w = (double)*(int *)&local_1c0->w;
          return (char *)((long)&local_1c0->w + 4);
        }
      }
      else if (dict_str._4_4_ == 7) {
        if (&local_1c0->e <= _len) {
          *(char **)w = local_1c0->w;
          if (0xfffffff1 < (uint)((long)*(undefined8 *)w >> 0x2f)) {
            w[0] = '\0';
            w[1] = '\0';
            w[2] = '\0';
            w[3] = '\0';
            w[4] = '\0';
            w[5] = '\0';
            w[6] = -8;
            w[7] = -1;
            return (char *)&local_1c0->e;
          }
          return (char *)&local_1c0->e;
        }
      }
      else {
        if (dict_str._4_4_ < 3) {
          *(ulong *)w = (ulong)dict_str._4_4_ << 0x2f ^ 0xffffffffffffffff;
          return (char *)local_1c0;
        }
        if (dict_str._4_4_ != 0xf) {
          if ((dict_str._4_4_ < 8) || (0xe < dict_str._4_4_)) {
            if ((dict_str._4_4_ < 0x10) || (0x12 < dict_str._4_4_)) {
              if (dict_str._4_4_ < 6) {
                local_348 = (char *)0x0;
                if (dict_str._4_4_ == 4) {
                  if (_len < (SBufExt *)((long)&local_1c0->w + 4U)) goto LAB_00140645;
                  local_d8 = local_1c0;
                  local_348 = (char *)(ulong)*(uint *)&local_1c0->w;
                  sbx_local = (SBufExt *)((long)&local_1c0->w + 4);
                }
                else if (dict_str._4_4_ == 5) {
                  if (_len < &local_1c0->e) goto LAB_00140645;
                  local_348 = local_1c0->w;
                  sbx_local = (SBufExt *)&local_1c0->e;
                }
                pvVar6 = lj_lightud_intern((lua_State *)(o_local[3].u64 & 0xfffffffffffffff8),
                                           local_348);
                *(ulong *)pcVar2 = (ulong)pvVar6 | 0xfffe000000000000;
                return (char *)sbx_local;
              }
            }
            else {
              uVar3 = 8;
              if (dict_str._4_4_ == 0x12) {
                uVar3 = 0x10;
              }
              if (_len < (SBufExt *)((long)&local_1c0->w + (ulong)uVar3)) goto LAB_00140645;
              if (*(long *)(*(long *)((o_local[3].u64 & 0xfffffffffffffff8) + 0x10) + 0x180) != 0) {
                local_88 = (lua_State *)(o_local[3].u64 & 0xfffffffffffffff8);
                if (dict_str._4_4_ == 0x10) {
                  local_37c = 0xb;
                }
                else {
                  local_37c = 0x10;
                  if (dict_str._4_4_ == 0x11) {
                    local_37c = 0xc;
                  }
                }
                cd_1._4_4_ = local_37c;
                cd_1._0_4_ = uVar3;
                pvVar6 = lj_mem_newgco(local_88,(ulong)uVar3 + 0x10);
                *(undefined1 *)((long)pvVar6 + 9) = 10;
                *(short *)((long)pvVar6 + 10) = (short)cd_1._4_4_;
                local_98 = pvVar6;
                memcpy((void *)((long)pvVar6 + 0x10),sbx_local,(ulong)uVar3);
                if (uVar3 == 0x10) {
                  if (0xfffffff1 < (uint)((long)*(undefined8 *)((long)pvVar6 + 0x10) >> 0x2f)) {
                    *(undefined8 *)((long)pvVar6 + 0x10) = 0xfff8000000000000;
                  }
                  if (0xfffffff1 < (uint)((long)*(undefined8 *)((long)pvVar6 + 0x18) >> 0x2f)) {
                    *(undefined8 *)((long)pvVar6 + 0x18) = 0xfff8000000000000;
                  }
                }
                *(ulong *)w = (ulong)pvVar6 | 0xfffa800000000000;
                return (char *)((long)&sbx_local->w + (ulong)uVar3);
              }
            }
LAB_00140606:
            lj_err_callerv((lua_State *)(o_local[3].u64 & 0xfffffffffffffff8),LJ_ERR_BUFFER_BADDEC,
                           (ulong)dict_str._4_4_);
          }
          local_2e0 = 0;
          t._4_4_ = 0;
          dict_mt = (GCtab *)0x0;
          if (o_local[8].field_4.i < 1) {
            lj_err_caller((lua_State *)(o_local[3].u64 & 0xfffffffffffffff8),LJ_ERR_BUFFER_DEPTH);
          }
          o_local[8].field_4.i = o_local[8].field_4.i + -1;
          if (dict_str._4_4_ == 0xe) {
            local_218 = local_1c0;
            local_220 = _len;
            puStack_228 = (uint32_t *)((long)&oa + 4);
            if (local_1c0 < _len) {
              oa._4_4_ = (uint)*(byte *)&local_1c0->w;
              local_218 = (SBufExt *)((long)&local_1c0->w + 1);
              local_22c = oa._4_4_;
              if (0xdf < oa._4_4_) {
                local_218 = (SBufExt *)serialize_ru124_((char *)local_218,(char *)_len,puStack_228);
              }
              local_210 = local_218;
            }
            else {
              local_210 = (SBufExt *)0x0;
            }
            sbx_local = local_210;
            if (local_210 == (SBufExt *)0x0) goto LAB_00140645;
            oa._4_4_ = oa._4_4_ + 1;
            uStack_300 = o_local[7].u64;
            if (((uStack_300 == 0) || (*(uint *)(uStack_300 + 0x30) <= oa._4_4_)) ||
               ((int)((long)*(undefined8 *)(*(long *)(uStack_300 + 0x10) + (ulong)oa._4_4_ * 8) >>
                     0x2f) != -0xc)) {
              lj_err_callerv((lua_State *)(o_local[3].u64 & 0xfffffffffffffff8),
                             LJ_ERR_BUFFER_BADDICTX,(ulong)oa._4_4_);
            }
            dict_mt = (GCtab *)(*(ulong *)(*(long *)(uStack_300 + 0x10) + (ulong)oa._4_4_ * 8) &
                               0x7fffffffffff);
            local_240 = local_210;
            local_248 = _len;
            puStack_250 = (uint32_t *)((long)&dict_str + 4);
            if (local_210 < _len) {
              dict_str._4_4_ = (uint)*(byte *)&local_210->w;
              local_240 = (SBufExt *)((long)&local_210->w + 1);
              local_254 = dict_str._4_4_;
              if (0xdf < dict_str._4_4_) {
                local_240 = (SBufExt *)serialize_ru124_((char *)local_240,(char *)_len,puStack_250);
              }
              local_238 = local_240;
            }
            else {
              local_238 = (SBufExt *)0x0;
            }
            sbx_local = local_238;
            if (local_238 == (SBufExt *)0x0) goto LAB_00140645;
            if ((dict_str._4_4_ < 8) || (0xd < dict_str._4_4_)) goto LAB_00140606;
          }
          if (9 < dict_str._4_4_) {
            local_268 = sbx_local;
            local_270 = _len;
            puStack_278 = &local_2e0;
            if (sbx_local < _len) {
              local_2e0 = (uint32_t)*(byte *)&sbx_local->w;
              local_268 = (SBufExt *)((long)&sbx_local->w + 1);
              local_27c = local_2e0;
              if (0xdf < local_2e0) {
                local_268 = (SBufExt *)serialize_ru124_((char *)local_268,(char *)_len,puStack_278);
              }
              local_260 = local_268;
            }
            else {
              local_260 = (SBufExt *)0x0;
            }
            sbx_local = local_260;
            if (local_260 == (SBufExt *)0x0) goto LAB_00140645;
          }
          if ((dict_str._4_4_ & 1) != 0) {
            local_290 = sbx_local;
            local_298 = _len;
            puStack_2a0 = (uint32_t *)((long)&t + 4);
            if (sbx_local < _len) {
              t._4_4_ = (uint)*(byte *)&sbx_local->w;
              local_290 = (SBufExt *)((long)&sbx_local->w + 1);
              r_local._4_4_ = t._4_4_;
              if (0xdf < t._4_4_) {
                local_290 = (SBufExt *)serialize_ru124_((char *)local_290,(char *)_len,puStack_2a0);
              }
              local_288 = local_290;
            }
            else {
              local_288 = (SBufExt *)0x0;
            }
            sbx_local = local_288;
            if (local_288 == (SBufExt *)0x0) goto LAB_00140645;
          }
          if (t._4_4_ == 0) {
            local_370 = 0;
          }
          else {
            if (t._4_4_ == 1) {
              local_36c = 1;
            }
            else {
              iVar1 = 0x1f;
              if (t._4_4_ - 1 != 0) {
                for (; t._4_4_ - 1 >> iVar1 == 0; iVar1 = iVar1 + -1) {
                }
              }
              local_36c = iVar1 + 1;
            }
            local_370 = local_36c;
          }
          mt = lj_tab_new((lua_State *)(o_local[3].u64 & 0xfffffffffffffff8),local_2e0,local_370);
          (mt->metatable).gcptr64 = (uint64_t)dict_mt;
          local_1a8 = o_local[3].u64 & 0xfffffffffffffff8;
          local_1b0 = w;
          local_190 = w;
          local_19c = 0xfffffff4;
          local_170 = w;
          local_17c = 0xfffffff4;
          *(ulong *)w = (ulong)mt | 0xfffa000000000000;
          local_160 = w;
          local_168 = "store to dead GC object";
          local_1b8 = mt;
          local_198 = mt;
          local_188 = local_1a8;
          local_178 = mt;
          local_158 = local_1a8;
          if (local_2e0 != 0) {
            oe = (TValue *)((mt->array).ptr64 + (long)(int)(uint)(0xb < dict_str._4_4_) * 8);
            k.u64 = (mt->array).ptr64 + (ulong)local_2e0 * 8;
            while (pTVar5 = oe, oe < k.u64) {
              oe = oe + 1;
              sbx_local = (SBufExt *)
                          serialize_get((char *)sbx_local,(SBufExt *)&o_local->gcr,pTVar5);
            }
          }
          while( true ) {
            if (t._4_4_ == 0) {
              o_local[8].field_4.i = o_local[8].field_4.i + 1;
              return (char *)sbx_local;
            }
            sbx_local = (SBufExt *)
                        serialize_get((char *)sbx_local,(SBufExt *)&o_local->gcr,(TValue *)&v_6);
            pTVar5 = lj_tab_set((lua_State *)(o_local[3].u64 & 0xfffffffffffffff8),mt,
                                (cTValue *)&v_6);
            if (pTVar5->u64 != 0xffffffffffffffff) break;
            sbx_local = (SBufExt *)serialize_get((char *)sbx_local,(SBufExt *)&o_local->gcr,pTVar5);
            t._4_4_ = t._4_4_ - 1;
          }
          lj_err_caller((lua_State *)(o_local[3].u64 & 0xfffffffffffffff8),LJ_ERR_BUFFER_DUPKEY);
        }
        local_1f0 = local_1c0;
        local_1f8 = _len;
        puStack_200 = &nhash;
        if (local_1c0 < _len) {
          nhash = (uint32_t)*(byte *)&local_1c0->w;
          local_1f0 = (SBufExt *)((long)&local_1c0->w + 1);
          local_204 = nhash;
          if (0xdf < nhash) {
            local_1f0 = (SBufExt *)serialize_ru124_((char *)local_1f0,(char *)_len,puStack_200);
          }
          local_1e8 = local_1f0;
        }
        else {
          local_1e8 = (SBufExt *)0x0;
        }
        sbx_local = local_1e8;
        if (local_1e8 != (SBufExt *)0x0) {
          nhash = nhash + 1;
          _narray = o_local[6].u64;
          if (((_narray != 0) && (nhash < *(uint *)(_narray + 0x30))) &&
             ((int)((long)*(undefined8 *)(*(long *)(_narray + 0x10) + (ulong)nhash * 8) >> 0x2f) ==
              -5)) {
            *(undefined8 *)w = *(undefined8 *)(*(long *)(_narray + 0x10) + (ulong)nhash * 8);
            return (char *)local_1e8;
          }
          lj_err_callerv((lua_State *)(o_local[3].u64 & 0xfffffffffffffff8),LJ_ERR_BUFFER_BADDICTX,
                         (ulong)nhash);
        }
      }
    }
    else {
      dict_str._0_4_ = dict_str._4_4_ - 0x20;
      if ((uint)dict_str <= (uint)((int)_len - (int)local_1c0)) {
        pGVar4 = lj_str_new((lua_State *)(o_local[3].u64 & 0xfffffffffffffff8),(char *)local_1c0,
                            (ulong)(uint)dict_str);
        *(ulong *)pcVar2 = (ulong)pGVar4 | 0xfffd800000000000;
        return (char *)((long)&sbx_local->w + (ulong)(uint)dict_str);
      }
    }
  }
LAB_00140645:
  lj_err_caller((lua_State *)(o_local[3].u64 & 0xfffffffffffffff8),LJ_ERR_BUFFER_EOB);
}

Assistant:

static char *serialize_get(char *r, SBufExt *sbx, TValue *o)
{
  char *w = sbx->w;
  uint32_t tp;
  r = serialize_ru124(r, w, &tp); if (LJ_UNLIKELY(!r)) goto eob;
  if (LJ_LIKELY(tp >= SER_TAG_STR)) {
    uint32_t len = tp - SER_TAG_STR;
    if (LJ_UNLIKELY(len > (uint32_t)(w - r))) goto eob;
    setstrV(sbufL(sbx), o, lj_str_new(sbufL(sbx), r, len));
    r += len;
  } else if (tp == SER_TAG_INT) {
    if (LJ_UNLIKELY(r + 4 > w)) goto eob;
    setintV(o, (int32_t)(LJ_BE ? lj_bswap(lj_getu32(r)) : lj_getu32(r)));
    r += 4;
  } else if (tp == SER_TAG_NUM) {
    if (LJ_UNLIKELY(r + 8 > w)) goto eob;
    memcpy(o, r, 8); r += 8;
#if LJ_BE
    o->u64 = lj_bswap64(o->u64);
#endif
    if (!tvisnum(o)) setnanV(o);  /* Fix non-canonical NaNs. */
  } else if (tp <= SER_TAG_TRUE) {
    setpriV(o, ~tp);
  } else if (tp == SER_TAG_DICT_STR) {
    GCtab *dict_str;
    uint32_t idx;
    r = serialize_ru124(r, w, &idx); if (LJ_UNLIKELY(!r)) goto eob;
    idx++;
    dict_str = tabref(sbx->dict_str);
    if (dict_str && idx < dict_str->asize && tvisstr(arrayslot(dict_str, idx)))
      copyTV(sbufL(sbx), o, arrayslot(dict_str, idx));
    else
      lj_err_callerv(sbufL(sbx), LJ_ERR_BUFFER_BADDICTX, idx);
  } else if (tp >= SER_TAG_TAB && tp <= SER_TAG_DICT_MT) {
    uint32_t narray = 0, nhash = 0;
    GCtab *t, *mt = NULL;
    if (sbx->depth <= 0) lj_err_caller(sbufL(sbx), LJ_ERR_BUFFER_DEPTH);
    sbx->depth--;
    if (tp == SER_TAG_DICT_MT) {
      GCtab *dict_mt;
      uint32_t idx;
      r = serialize_ru124(r, w, &idx); if (LJ_UNLIKELY(!r)) goto eob;
      idx++;
      dict_mt = tabref(sbx->dict_mt);
      if (dict_mt && idx < dict_mt->asize && tvistab(arrayslot(dict_mt, idx)))
	mt = tabV(arrayslot(dict_mt, idx));
      else
	lj_err_callerv(sbufL(sbx), LJ_ERR_BUFFER_BADDICTX, idx);
      r = serialize_ru124(r, w, &tp); if (LJ_UNLIKELY(!r)) goto eob;
      if (!(tp >= SER_TAG_TAB && tp < SER_TAG_DICT_MT)) goto badtag;
    }
    if (tp >= SER_TAG_TAB+2) {
      r = serialize_ru124(r, w, &narray); if (LJ_UNLIKELY(!r)) goto eob;
    }
    if ((tp & 1)) {
      r = serialize_ru124(r, w, &nhash); if (LJ_UNLIKELY(!r)) goto eob;
    }
    t = lj_tab_new(sbufL(sbx), narray, hsize2hbits(nhash));
    /* NOBARRIER: The table is new (marked white). */
    setgcref(t->metatable, obj2gco(mt));
    settabV(sbufL(sbx), o, t);
    if (narray) {
      TValue *oa = tvref(t->array) + (tp >= SER_TAG_TAB+4);
      TValue *oe = tvref(t->array) + narray;
      while (oa < oe) r = serialize_get(r, sbx, oa++);
    }
    if (nhash) {
      do {
	TValue k, *v;
	r = serialize_get(r, sbx, &k);
	v = lj_tab_set(sbufL(sbx), t, &k);
	if (LJ_UNLIKELY(!tvisnil(v)))
	  lj_err_caller(sbufL(sbx), LJ_ERR_BUFFER_DUPKEY);
	r = serialize_get(r, sbx, v);
      } while (--nhash);
    }
    sbx->depth++;
#if LJ_HASFFI
  } else if (tp >= SER_TAG_INT64 &&  tp <= SER_TAG_COMPLEX) {
    uint32_t sz = tp == SER_TAG_COMPLEX ? 16 : 8;
    GCcdata *cd;
    if (LJ_UNLIKELY(r + sz > w)) goto eob;
    if (LJ_UNLIKELY(!ctype_ctsG(G(sbufL(sbx))))) goto badtag;
    cd = lj_cdata_new_(sbufL(sbx),
	   tp == SER_TAG_INT64 ? CTID_INT64 :
	   tp == SER_TAG_UINT64 ? CTID_UINT64 : CTID_COMPLEX_DOUBLE,
	   sz);
    memcpy(cdataptr(cd), r, sz); r += sz;
#if LJ_BE
    *(uint64_t *)cdataptr(cd) = lj_bswap64(*(uint64_t *)cdataptr(cd));
    if (sz == 16)
      ((uint64_t *)cdataptr(cd))[1] = lj_bswap64(((uint64_t *)cdataptr(cd))[1]);
#endif
    if (sz == 16) {  /* Fix non-canonical NaNs. */
      TValue *cdo = (TValue *)cdataptr(cd);
      if (!tvisnum(&cdo[0])) setnanV(&cdo[0]);
      if (!tvisnum(&cdo[1])) setnanV(&cdo[1]);
    }
    setcdataV(sbufL(sbx), o, cd);
#endif
  } else if (tp <= (LJ_64 ? SER_TAG_LIGHTUD64 : SER_TAG_LIGHTUD32)) {
    uintptr_t ud = 0;
    if (tp == SER_TAG_LIGHTUD32) {
      if (LJ_UNLIKELY(r + 4 > w)) goto eob;
      ud = (uintptr_t)(LJ_BE ? lj_bswap(lj_getu32(r)) : lj_getu32(r));
      r += 4;
    }
#if LJ_64
    else if (tp == SER_TAG_LIGHTUD64) {
      if (LJ_UNLIKELY(r + 8 > w)) goto eob;
      memcpy(&ud, r, 8); r += 8;
#if LJ_BE
      ud = lj_bswap64(ud);
#endif
    }
    setrawlightudV(o, lj_lightud_intern(sbufL(sbx), (void *)ud));
#else
    setrawlightudV(o, (void *)ud);
#endif
  } else {
badtag:
    lj_err_callerv(sbufL(sbx), LJ_ERR_BUFFER_BADDEC, tp);
  }
  return r;
eob:
  lj_err_caller(sbufL(sbx), LJ_ERR_BUFFER_EOB);
  return NULL;
}